

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

IntegerTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntegerTypeSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,Token *args_2,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_3)

{
  Token signing;
  Token keyword;
  IntegerTypeSyntax *this_00;
  
  this_00 = (IntegerTypeSyntax *)allocate(this,0x60,8);
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  signing.kind = args_2->kind;
  signing._2_1_ = args_2->field_0x2;
  signing.numFlags.raw = (args_2->numFlags).raw;
  signing.rawLen = args_2->rawLen;
  signing.info = args_2->info;
  slang::syntax::IntegerTypeSyntax::IntegerTypeSyntax(this_00,*args,keyword,signing,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }